

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSLogger.cpp
# Opt level: O3

double __thiscall PSLogger::log(PSLogger *this,double __x)

{
  ostream *poVar1;
  undefined8 *in_RCX;
  char *pcVar2;
  undefined8 *in_RDX;
  uint in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string enum_str;
  long *local_48;
  char *local_40;
  long local_38 [2];
  
  if ((int)this->log_verbosity <= (int)in_ESI) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
    if (in_ESI < 6) {
      pcVar2 = &DAT_0014ded4 + *(int *)(&DAT_0014ded4 + (ulong)in_ESI * 4);
    }
    else {
      pcVar2 = "UNKNOWN LOGTYPE";
    }
    std::__cxx11::string::_M_replace((ulong)&local_48,0,local_40,(ulong)pcVar2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_48,(long)local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*in_RDX,in_RDX[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*in_RCX,in_RCX[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    __x = extraout_XMM0_Qa;
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
      __x = extraout_XMM0_Qa_00;
    }
  }
  return __x;
}

Assistant:

void PSLogger::log(LogType p_type, std::string p_category, std::string p_msg)
{
    if(p_type < log_verbosity )
    {
        return;
    }

    std::string enum_str = "";
    switch(p_type)
    {
    case LogType::None:
    enum_str = "None";
        break;
    case LogType::VerboseLog:
    enum_str = "VerboseLog";
        break;
    case LogType::Log:
    enum_str = "Log";
        break;
    case LogType::Warning:
    enum_str = "Warning";
        break;
    case LogType::Error:
    enum_str = "Error";
        break;
    case LogType::Critical:
    enum_str = "Critical";
        break;
    default:
    enum_str = "UNKNOWN LOGTYPE";
        break;
    }

    std::cout << enum_str << " : " << p_category << " : " << p_msg << "\n";
}